

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  char *pcVar2;
  long local_5b0;
  ifstream fin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  undefined1 local_368 [8];
  string src_dir;
  ifstream fin;
  undefined1 local_140 [8];
  string src_dir_txt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string dir;
  string local_a0;
  undefined1 local_70 [8];
  string exe;
  string errorMsg;
  string exe_dir;
  char *argv0_local;
  
  std::__cxx11::string::string((string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  bVar1 = cmsys::SystemTools::FindProgramPath
                    (argv0,(string *)local_70,(string *)(exe.field_2._M_local_buf + 8),(char *)0x0,
                     (char *)0x0,(char *)0x0);
  if (bVar1) {
    cmsys::SystemTools::GetRealPath(&local_a0,(string *)local_70,(string *)0x0);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    cmsys::SystemTools::GetFilenamePath((string *)((long)&dir.field_2 + 8),(string *)local_70);
    std::__cxx11::string::operator=
              ((string *)(errorMsg.field_2._M_local_buf + 8),
               (string *)(dir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,"/cmake");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,pcVar2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCTestCommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCTestCommand_abi_cxx11_,"/ctest");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCTestCommand_abi_cxx11_,pcVar2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCPackCommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCPackCommand_abi_cxx11_,"/cpack");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCPackCommand_abi_cxx11_,pcVar2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,"/cmake-gui");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,"");
  }
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,"/ccmake");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,"");
  }
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,
             (string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,"/cmcldeps");
  pcVar2 = cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::operator+=((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,"");
  }
  cmsys::SystemTools::GetFilenamePath((string *)local_e0,(string *)((long)&errorMsg.field_2 + 8));
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 "/share/cmake-3.5");
  std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&local_100)
  ;
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&src_dir_txt.field_2 + 8),&cmSystemToolsCMakeRoot_abi_cxx11_,
                 "/Modules/CMake.cmake");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  std::__cxx11::string::~string((string *)(src_dir_txt.field_2._M_local_buf + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   "/CMakeFiles/CMakeSourceDir.txt");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&src_dir.field_2 + 8),pcVar2,_S_in);
    std::__cxx11::string::string((string *)local_368);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&src_dir.field_2 + *(long *)(src_dir.field_2._8_8_ + -0x18) + 8
                              ));
    if (((bVar1) &&
        (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)(src_dir.field_2._M_local_buf + 8),(string *)local_368,
                            (bool *)0x0,-1), bVar1)) &&
       (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_368), bVar1)) {
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_368);
    }
    else {
      cmsys::SystemTools::GetFilenamePath(&local_388,(string *)local_e0);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::operator+(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "/CMakeFiles/CMakeSourceDir.txt");
      std::__cxx11::string::operator=((string *)local_140,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_5b0,pcVar2,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_5b0 + *(long *)(local_5b0 + -0x18)));
      if (((bVar1) &&
          (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_5b0,(string *)local_368,(bool *)0x0,-1), bVar1)) &&
         (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_368), bVar1)) {
        std::__cxx11::string::operator=
                  ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_368);
      }
      std::ifstream::~ifstream(&local_5b0);
    }
    std::__cxx11::string::~string((string *)local_368);
    std::ifstream::~ifstream((void *)((long)&src_dir.field_2 + 8));
    std::__cxx11::string::~string((string *)local_140);
  }
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(errorMsg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmSystemTools::FindCMakeResources(const char* argv0)
{
  std::string exe_dir;
#if defined(_WIN32) && !defined(__CYGWIN__)
  (void)argv0; // ignore this on windows
  wchar_t modulepath[_MAX_PATH];
  ::GetModuleFileNameW(NULL, modulepath, sizeof(modulepath));
  exe_dir =
    cmSystemTools::GetFilenamePath(cmsys::Encoding::ToNarrow(modulepath));
#elif defined(__APPLE__)
  (void)argv0; // ignore this on OS X
# define CM_EXE_PATH_LOCAL_SIZE 16384
  char exe_path_local[CM_EXE_PATH_LOCAL_SIZE];
# if defined(MAC_OS_X_VERSION_10_3) && !defined(MAC_OS_X_VERSION_10_4)
  unsigned long exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
# else
  uint32_t exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
# endif
# undef CM_EXE_PATH_LOCAL_SIZE
  char* exe_path = exe_path_local;
  if(_NSGetExecutablePath(exe_path, &exe_path_size) < 0)
    {
    exe_path = (char*)malloc(exe_path_size);
    _NSGetExecutablePath(exe_path, &exe_path_size);
    }
  exe_dir =
    cmSystemTools::GetFilenamePath(
      cmSystemTools::GetRealPath(exe_path));
  if(exe_path != exe_path_local)
    {
    free(exe_path);
    }
  if(cmSystemTools::GetFilenameName(exe_dir) == "MacOS")
    {
    // The executable is inside an application bundle.
    // Look for ../bin (install tree) and then fall back to
    // ../../../bin (build tree).
    exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
    if(cmSystemTools::FileExists((exe_dir+"/bin/cmake").c_str()))
      {
      exe_dir += "/bin";
      }
    else
      {
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
      }
    }
#else
  std::string errorMsg;
  std::string exe;
  if(cmSystemTools::FindProgramPath(argv0, exe, errorMsg))
    {
    // remove symlinks
    exe = cmSystemTools::GetRealPath(exe);
    exe_dir =
      cmSystemTools::GetFilenamePath(exe);
    }
  else
    {
    // ???
    }
#endif
  cmSystemToolsCMakeCommand = exe_dir;
  cmSystemToolsCMakeCommand += "/cmake";
  cmSystemToolsCMakeCommand += cmSystemTools::GetExecutableExtension();
#ifndef CMAKE_BUILD_WITH_CMAKE
  // The bootstrap cmake does not provide the other tools,
  // so use the directory where they are about to be built.
  exe_dir = CMAKE_BOOTSTRAP_BINARY_DIR "/bin";
#endif
  cmSystemToolsCTestCommand = exe_dir;
  cmSystemToolsCTestCommand += "/ctest";
  cmSystemToolsCTestCommand += cmSystemTools::GetExecutableExtension();
  cmSystemToolsCPackCommand = exe_dir;
  cmSystemToolsCPackCommand += "/cpack";
  cmSystemToolsCPackCommand += cmSystemTools::GetExecutableExtension();
  cmSystemToolsCMakeGUICommand = exe_dir;
  cmSystemToolsCMakeGUICommand += "/cmake-gui";
  cmSystemToolsCMakeGUICommand += cmSystemTools::GetExecutableExtension();
  if(!cmSystemTools::FileExists(cmSystemToolsCMakeGUICommand.c_str()))
    {
    cmSystemToolsCMakeGUICommand = "";
    }
  cmSystemToolsCMakeCursesCommand = exe_dir;
  cmSystemToolsCMakeCursesCommand += "/ccmake";
  cmSystemToolsCMakeCursesCommand += cmSystemTools::GetExecutableExtension();
  if(!cmSystemTools::FileExists(cmSystemToolsCMakeCursesCommand.c_str()))
    {
    cmSystemToolsCMakeCursesCommand = "";
    }
  cmSystemToolsCMClDepsCommand = exe_dir;
  cmSystemToolsCMClDepsCommand += "/cmcldeps";
  cmSystemToolsCMClDepsCommand += cmSystemTools::GetExecutableExtension();
  if(!cmSystemTools::FileExists(cmSystemToolsCMClDepsCommand.c_str()))
    {
    cmSystemToolsCMClDepsCommand = "";
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Install tree has "<prefix>/bin/cmake" and "<prefix><CMAKE_DATA_DIR>".
  std::string dir = cmSystemTools::GetFilenamePath(exe_dir);
  cmSystemToolsCMakeRoot = dir + CMAKE_DATA_DIR;
  if(!cmSystemTools::FileExists(
       (cmSystemToolsCMakeRoot+"/Modules/CMake.cmake").c_str()))
    {
    // Build tree has "<build>/bin[/<config>]/cmake" and
    // "<build>/CMakeFiles/CMakeSourceDir.txt".
    std::string src_dir_txt = dir + "/CMakeFiles/CMakeSourceDir.txt";
    cmsys::ifstream fin(src_dir_txt.c_str());
    std::string src_dir;
    if(fin && cmSystemTools::GetLineFromStream(fin, src_dir) &&
       cmSystemTools::FileIsDirectory(src_dir))
      {
      cmSystemToolsCMakeRoot = src_dir;
      }
    else
      {
      dir = cmSystemTools::GetFilenamePath(dir);
      src_dir_txt = dir + "/CMakeFiles/CMakeSourceDir.txt";
      cmsys::ifstream fin2(src_dir_txt.c_str());
      if(fin2 && cmSystemTools::GetLineFromStream(fin2, src_dir) &&
         cmSystemTools::FileIsDirectory(src_dir))
        {
        cmSystemToolsCMakeRoot = src_dir;
        }
      }
    }
#else
  // Bootstrap build knows its source.
  cmSystemToolsCMakeRoot = CMAKE_BOOTSTRAP_SOURCE_DIR;
#endif
}